

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkState.cpp
# Opt level: O1

void __thiscall iDynTree::LinkAccArray::LinkAccArray(LinkAccArray *this,Model *model)

{
  (this->m_linkAcc).super__Vector_base<iDynTree::SpatialAcc,_std::allocator<iDynTree::SpatialAcc>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_linkAcc).super__Vector_base<iDynTree::SpatialAcc,_std::allocator<iDynTree::SpatialAcc>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_linkAcc).super__Vector_base<iDynTree::SpatialAcc,_std::allocator<iDynTree::SpatialAcc>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  resize(this,model);
  return;
}

Assistant:

LinkAccArray::LinkAccArray(const Model& model)
{
    resize(model);
}